

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapeTriang>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  long *plVar1;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  TPZManVector<int,_27> scalarOrders;
  undefined1 local_150 [8];
  undefined1 local_148 [16];
  ulong local_138;
  int local_130;
  int iStack_12c;
  int iStack_128;
  int iStack_124;
  undefined1 local_c0 [16];
  ulong uStack_b0;
  ulong local_a8;
  int local_a0 [28];
  
  local_148 = (undefined1  [16])0x0;
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZManVector_01840b58;
  uVar10 = ids->fNElements;
  if ((long)uVar10 < 9) {
    local_148._0_8_ = &local_130;
    local_138 = 0;
  }
  else {
    local_148._0_8_ = operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 * 8);
    local_138 = uVar10;
  }
  if (0 < (long)uVar10) {
    plVar1 = ids->fStore;
    uVar5 = 0;
    do {
      *(long *)(local_148._0_8_ + uVar5 * 8) = plVar1[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
  }
  local_148._8_8_ = uVar10;
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)local_150);
  if ((int *)local_148._0_8_ == &local_130) {
    local_148._0_8_ = (long *)0x0;
  }
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZVec_0183b5f0;
  if ((long *)local_148._0_8_ != (long *)0x0) {
    operator_delete__((void *)local_148._0_8_);
  }
  local_148 = (undefined1  [16])0x0;
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZManVector_01840040;
  uVar10 = sideorient->fNElements;
  if ((long)uVar10 < 0x15) {
    local_148._0_8_ = &local_130;
    local_138 = 0;
  }
  else {
    local_148._0_8_ = operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | uVar10 * 4);
    local_138 = uVar10;
  }
  if (0 < (long)uVar10) {
    piVar2 = sideorient->fStore;
    uVar5 = 0;
    do {
      *(int *)(local_148._0_8_ + uVar5 * 4) = piVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
  }
  local_148._8_8_ = uVar10;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,(TPZManVector<int,_20> *)local_150);
  if ((int *)local_148._0_8_ == &local_130) {
    local_148._0_8_ = (long *)0x0;
  }
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZVec_0183b5b0;
  if ((long *)local_148._0_8_ != (long *)0x0) {
    operator_delete__((void *)local_148._0_8_);
  }
  iVar7 = connectorders->fStore[3];
  TPZVec<int>::TPZVec((TPZVec<int> *)local_150,0);
  local_150 = (undefined1  [8])&PTR__TPZManVector_01840098;
  local_148._8_8_ = 4;
  local_148._0_8_ = &local_130;
  local_138 = 0;
  local_130 = iVar7 + 1;
  iStack_12c = local_130;
  iStack_128 = local_130;
  iStack_124 = local_130;
  TPZShapeH1<pzshape::TPZShapeTriang>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,(TPZVec<int> *)local_150,data);
  if (connectorders->fNElements != 4) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x26);
  }
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_a8 = 0;
  local_c0._0_8_ = &PTR__TPZManVector_01840098;
  uVar10 = connectorders->fNElements;
  if ((long)uVar10 < 0x1c) {
    local_c0._8_8_ = local_a0;
    local_a8 = 0;
  }
  else {
    local_c0._8_8_ = operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | uVar10 * 4);
    local_a8 = uVar10;
  }
  if (0 < (long)uVar10) {
    piVar2 = connectorders->fStore;
    uVar5 = 0;
    do {
      *(int *)(local_c0._8_8_ + uVar5 * 4) = piVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
  }
  uStack_b0 = uVar10;
  TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,(TPZManVector<int,_27> *)local_c0);
  if ((int *)local_c0._8_8_ == local_a0) {
    local_c0._8_8_ = (int *)0x0;
  }
  local_a8 = 0;
  local_c0._0_8_ = &PTR__TPZVec_0183b5b0;
  if ((int *)local_c0._8_8_ != (int *)0x0) {
    operator_delete__((void *)local_c0._8_8_);
  }
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,4);
  piVar2 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore;
  piVar3 = (data->fHDivNumConnectShape).super_TPZVec<int>.fStore;
  lVar6 = 0;
  iVar7 = 0;
  do {
    iVar8 = piVar2[lVar6] + 1;
    iVar9 = iVar8 * iVar8 + -1;
    if (lVar6 != 3) {
      iVar9 = iVar8;
    }
    piVar3[lVar6] = iVar9;
    iVar7 = iVar7 + iVar9;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar7);
  ComputeMasterDirections(data);
  ComputeVecandShape(data);
  iVar7 = (int)(data->fHDivConnectOrders).super_TPZVec<int>.fNElements;
  if (1 < (long)iVar7) {
    uVar10 = 0;
    do {
      if ((data->fHDivConnectOrders).super_TPZVec<int>.fStore[(long)iVar7 + -1] <
          (data->fHDivConnectOrders).super_TPZVec<int>.fStore[uVar10]) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                   ,0x3e);
      }
      uVar10 = uVar10 + 1;
    } while (iVar7 - 1 != uVar10);
  }
  if ((int *)local_148._0_8_ == &local_130) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_148._8_8_;
    local_148 = auVar4 << 0x40;
  }
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZVec_0183b5b0;
  if ((long *)local_148._0_8_ != (long *)0x0) {
    operator_delete__((void *)local_148._0_8_);
  }
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}